

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testFromCStr(String *str)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  __s1 = (str->view_)._M_str;
  if (__s1 == cstr) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.data() != cstr) failed on line ",0x2f);
    iVar2 = 0x89;
  }
  else if ((str->view_)._M_len == 3) {
    iVar2 = strncmp(__s1,cstr,3);
    if (iVar2 == 0) {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
      iVar2 = 0x8c;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0) failed on line ",0x43);
      iVar2 = 0x8b;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ",0x2c);
    iVar2 = 0x8a;
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return false;
}

Assistant:

static bool testFromCStr(cm::String const& str)
{
  ASSERT_TRUE(str.data() != cstr);
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}